

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int parse_codes(archive_read *a)

{
  _func_int_archive_read_ptr_archive_entry_ptr **br;
  archive_read_filter_bidder *lengths;
  _func_int64_t_archive_read_ptr_int64_t_int **p;
  uchar uVar1;
  UInt32 size;
  archive_read *a_00;
  _func_int_archive_read_ptr_archive_entry_ptr *p_Var2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Bool BVar7;
  int iVar8;
  char *pcVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  char in_R8B;
  uint uVar16;
  huffman_code precode;
  uchar bitlengths [20];
  huffman_code local_88;
  byte local_58 [32];
  CPpmd7z_RangeDec *local_38;
  
  a_00 = (archive_read *)a->format->data;
  br = &a_00[9].formats[4].read_header;
  free_codes(a_00);
  uVar4 = *(uint *)&a_00[9].formats[4].read_data & 0xfffffff8;
  *(uint *)&a_00[9].formats[4].read_data = uVar4;
  if ((int)uVar4 < 1) {
    iVar5 = rar_br_fillup(a,(rar_br *)br);
    uVar4 = *(uint *)&a_00[9].formats[4].read_data;
    if ((int)uVar4 < 1 && iVar5 == 0) goto LAB_00667f92;
  }
  iVar5 = uVar4 - 1;
  uVar12 = (ulong)a_00[9].formats[4].read_header >> ((byte)iVar5 & 0x3f);
  *(byte *)((long)&a_00->formats[3].read_data_skip + 2) = (byte)uVar12 & 1;
  *(int *)&a_00[9].formats[4].read_data = iVar5;
  if ((uVar12 & 1) == 0) {
    if ((int)uVar4 < 2) {
      iVar6 = rar_br_fillup(a,(rar_br *)br);
      iVar5 = *(int *)&a_00[9].formats[4].read_data;
      if (iVar5 < 1 && iVar6 == 0) goto LAB_00667f92;
    }
    uVar12 = (ulong)(iVar5 - 1U);
    if (((ulong)*br >> (uVar12 & 0x3f) & 1) == 0) {
      memset(a_00->bidders + 8,0,0x194);
    }
    *(uint *)&a_00[9].formats[4].read_data = iVar5 - 1U;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[8] = 0;
    local_58[9] = 0;
    local_58[10] = 0;
    local_58[0xb] = 0;
    local_58[0xc] = 0;
    local_58[0xd] = 0;
    local_58[0xe] = 0;
    local_58[0xf] = 0;
    local_58[0x10] = 0;
    local_58[0x11] = 0;
    local_58[0x12] = 0;
    local_58[0x13] = 0;
    uVar14 = 0;
    do {
      iVar5 = (int)uVar12;
      if (iVar5 < 4) {
        iVar6 = rar_br_fillup(a,(rar_br *)br);
        iVar5 = *(int *)&a_00[9].formats[4].read_data;
        if (iVar5 < 4 && iVar6 == 0) goto LAB_00667f92;
      }
      uVar4 = iVar5 - 4;
      uVar12 = (ulong)uVar4;
      bVar10 = (byte)((ulong)a_00[9].formats[4].read_header >> ((byte)uVar4 & 0x3f)) & 0xf;
      iVar6 = (int)uVar14;
      uVar15 = (ulong)iVar6;
      uVar14 = (ulong)(iVar6 + 1);
      local_58[uVar15] = bVar10;
      *(uint *)&a_00[9].formats[4].read_data = uVar4;
      if (bVar10 == 0xf) {
        if (iVar5 < 8) {
          iVar5 = rar_br_fillup(a,(rar_br *)br);
          uVar4 = *(uint *)&a_00[9].formats[4].read_data;
          if ((int)uVar4 < 4 && iVar5 == 0) goto LAB_00667f92;
        }
        uVar4 = uVar4 - 4;
        uVar12 = (ulong)uVar4;
        uVar13 = (ulong)a_00[9].formats[4].read_header >> ((byte)uVar4 & 0x3f);
        *(uint *)&a_00[9].formats[4].read_data = uVar4;
        if ((uVar13 & 0xf) != 0) {
          uVar14 = (ulong)((uint)uVar13 & 0xf) + 1;
          if (0x13 - iVar6 <= uVar14) {
            uVar14 = (ulong)(0x13 - iVar6);
          }
          memset(local_58 + uVar15,0,uVar14 + 1);
          uVar4 = 1;
          do {
            uVar14 = uVar15 + 1;
            if ((byte)(((byte)uVar13 & 0xf) + 2) <= uVar4) break;
            uVar4 = uVar4 + 1;
            bVar3 = (long)uVar15 < 0x13;
            uVar15 = uVar14;
          } while (bVar3);
        }
      }
    } while ((int)uVar14 < 0x14);
    local_88.minlength = 0;
    local_88.maxlength = 0;
    local_88.tablesize = 0;
    local_88._28_4_ = 0;
    local_88.tree = (huffman_tree_node *)0x0;
    local_88.numentries = 0;
    local_88.numallocatedentries = 0;
    local_88.table = (huffman_table_entry *)0x0;
    iVar5 = create_code(a,&local_88,local_58,0x14,in_R8B);
    if (iVar5 != 0) {
      free(local_88.tree);
      free(local_88.table);
      return iVar5;
    }
    lengths = a_00->bidders + 8;
    uVar12 = 0;
    do {
      uVar4 = read_next_symbol(a,&local_88);
      if ((int)uVar4 < 0) {
        free(local_88.tree);
        free(local_88.table);
        return -0x1e;
      }
      iVar5 = (int)uVar12;
      if (uVar4 < 0x10) {
        *(byte *)((long)&lengths->data + (long)iVar5) =
             (char)uVar4 + *(uchar *)((long)&lengths->data + (long)iVar5) & 0xf;
        uVar12 = (ulong)(iVar5 + 1);
      }
      else if (uVar4 < 0x12) {
        if (iVar5 == 0) {
          free(local_88.tree);
          free(local_88.table);
          pcVar9 = "Internal error extracting RAR file.";
          goto LAB_00667e60;
        }
        iVar6 = *(int *)&a_00[9].formats[4].read_data;
        if (uVar4 == 0x10) {
          if (iVar6 < 3) {
            iVar8 = rar_br_fillup(a,(rar_br *)br);
            iVar6 = *(int *)&a_00[9].formats[4].read_data;
            if (iVar6 < 3 && iVar8 == 0) goto LAB_00667f7e;
          }
          iVar6 = iVar6 + -3;
          iVar8 = 3;
          uVar4 = 7;
        }
        else {
          if (iVar6 < 7) {
            iVar8 = rar_br_fillup(a,(rar_br *)br);
            iVar6 = *(int *)&a_00[9].formats[4].read_data;
            if (iVar6 < 7 && iVar8 == 0) goto LAB_00667f7e;
          }
          iVar6 = iVar6 + -7;
          iVar8 = 0xb;
          uVar4 = 0x7f;
        }
        p_Var2 = a_00[9].formats[4].read_header;
        *(int *)&a_00[9].formats[4].read_data = iVar6;
        if (0x193 < iVar5) break;
        uVar1 = *(uchar *)((long)&a_00->bidders[7].vtable + (long)iVar5 + 7U);
        uVar11 = 1;
        uVar14 = (long)iVar5;
        do {
          *(uchar *)((long)&lengths->data + uVar14) = uVar1;
          uVar12 = uVar14 + 1;
          if ((uVar4 & (uint)((ulong)p_Var2 >> ((byte)iVar6 & 0x3f))) + iVar8 <= uVar11) break;
          uVar11 = uVar11 + 1;
          bVar3 = (long)uVar14 < 0x193;
          uVar14 = uVar12;
        } while (bVar3);
      }
      else {
        iVar6 = *(int *)&a_00[9].formats[4].read_data;
        if (uVar4 == 0x12) {
          if (iVar6 < 3) {
            iVar8 = rar_br_fillup(a,(rar_br *)br);
            iVar6 = *(int *)&a_00[9].formats[4].read_data;
            if (iVar6 < 3 && iVar8 == 0) {
LAB_00667f7e:
              free(local_88.tree);
              free(local_88.table);
              goto LAB_00667f92;
            }
          }
          iVar6 = iVar6 + -3;
          iVar8 = 3;
          uVar4 = 7;
        }
        else {
          if (iVar6 < 7) {
            iVar8 = rar_br_fillup(a,(rar_br *)br);
            iVar6 = *(int *)&a_00[9].formats[4].read_data;
            if (iVar6 < 7 && iVar8 == 0) goto LAB_00667f7e;
          }
          iVar6 = iVar6 + -7;
          iVar8 = 0xb;
          uVar4 = 0x7f;
        }
        p_Var2 = a_00[9].formats[4].read_header;
        *(int *)&a_00[9].formats[4].read_data = iVar6;
        if (0x193 < iVar5) break;
        uVar16 = (uVar4 & (uint)((ulong)p_Var2 >> ((byte)iVar6 & 0x3f))) + iVar8;
        uVar4 = uVar16 - 1;
        uVar11 = 0x193U - iVar5;
        if (uVar4 < 0x193U - iVar5) {
          uVar11 = uVar4;
        }
        memset((uchar *)((long)&lengths->data + (long)iVar5),0,(ulong)uVar11 + 1);
        uVar4 = 1;
        uVar14 = (long)iVar5;
        do {
          uVar12 = uVar14 + 1;
          if (uVar16 <= uVar4) break;
          uVar4 = uVar4 + 1;
          bVar3 = (long)uVar14 < 0x193;
          uVar14 = uVar12;
        } while (bVar3);
      }
    } while ((int)uVar12 < 0x194);
    free(local_88.tree);
    free(local_88.table);
    iVar5 = create_code(a,(huffman_code *)&a_00->bidders[1].name,(uchar *)lengths,299,in_R8B);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = create_code(a,(huffman_code *)(a_00->bidders + 3),
                        (uchar *)((long)&a_00->formats[0].format_capabilties + 3),0x3c,in_R8B);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = create_code(a,(huffman_code *)&a_00->bidders[4].vtable,
                        (uchar *)((long)&a_00->formats[1].read_data + 7),0x11,in_R8B);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = create_code(a,(huffman_code *)&a_00->bidders[6].name,(uchar *)&a_00->formats[1].cleanup,
                        0x1c,in_R8B);
    if (iVar5 != 0) {
      return iVar5;
    }
LAB_00667da6:
    if (((int)(a_00->client).position != 0) && (a_00->formats[2].name != (char *)0x0)) {
LAB_00667e3e:
      *(undefined1 *)&a_00->formats[2].cleanup = 0;
      return 0;
    }
    pcVar9 = (a_00->archive).error;
    uVar4 = 0x400000;
    if ((0x3fffff < (long)pcVar9) ||
       (uVar4 = (uint)((ulong)pcVar9 >> 1) & 0x7fffffff | (uint)pcVar9, uVar4 = uVar4 >> 2 | uVar4,
       uVar4 = uVar4 >> 4 | uVar4, uVar4 = uVar4 >> 8 | uVar4, uVar4 = uVar4 >> 0x10 | uVar4,
       uVar4 = (uVar4 - (uVar4 >> 1)) * 2, uVar4 != 0)) {
      pcVar9 = (char *)realloc(a_00->formats[2].name,(ulong)uVar4);
      if (pcVar9 != (char *)0x0) {
        a_00->formats[2].name = pcVar9;
        *(uint *)&(a_00->client).position = uVar4;
        memset(pcVar9,0,(ulong)uVar4);
        *(uint *)&a_00->formats[2].bid = uVar4 - 1;
        goto LAB_00667e3e;
      }
      pcVar9 = "Unable to allocate memory for uncompressed data.";
LAB_00667f48:
      iVar5 = 0xc;
      goto LAB_00667e65;
    }
    pcVar9 = "Zero window size is invalid.";
  }
  else {
    if ((int)uVar4 < 8) {
      iVar6 = rar_br_fillup(a,(rar_br *)br);
      iVar5 = *(int *)&a_00[9].formats[4].read_data;
      if (iVar5 < 7 && iVar6 == 0) goto LAB_00667f92;
    }
    iVar6 = iVar5 + -7;
    uVar12 = (ulong)a_00[9].formats[4].read_header >> ((byte)iVar6 & 0x3f);
    *(int *)&a_00[9].formats[4].read_data = iVar6;
    if ((uVar12 & 0x20) != 0) {
      if (iVar5 < 0xf) {
        iVar5 = rar_br_fillup(a,(rar_br *)br);
        iVar6 = *(int *)&a_00[9].formats[4].read_data;
        if (iVar6 < 8 && iVar5 == 0) goto LAB_00667f92;
      }
      iVar6 = iVar6 + -8;
      *(uint *)&(a_00->client).position =
           ((uint)((ulong)a_00[9].formats[4].read_header >> ((byte)iVar6 & 0x3f)) & 0xff) * 0x100000
           + 0x100000;
      *(int *)&a_00[9].formats[4].read_data = iVar6;
    }
    if ((uVar12 & 0x40) == 0) {
      *(undefined4 *)((long)&a_00->formats[3].read_data_skip + 4) = 2;
    }
    else {
      if (iVar6 < 8) {
        iVar5 = rar_br_fillup(a,(rar_br *)br);
        iVar6 = *(int *)&a_00[9].formats[4].read_data;
        if (iVar6 < 8 && iVar5 == 0) {
LAB_00667f92:
          archive_set_error(&a->archive,0x54,"Truncated RAR file data");
          *(undefined1 *)&(a_00->client).closer = 0;
          return -0x1e;
        }
      }
      uVar4 = (uint)((ulong)a_00[9].formats[4].read_header >> ((byte)(iVar6 + -8) & 0x3f)) & 0xff;
      *(uint *)((long)&a_00->formats[3].has_encrypted_entries + 4) = uVar4;
      *(uint *)((long)&a_00->formats[3].read_data_skip + 4) = uVar4;
      *(int *)&a_00[9].formats[4].read_data = iVar6 + -8;
    }
    if ((uVar12 & 0x20) == 0) {
      if (*(char *)&a_00->formats[3].read_data_skip == '\0') {
        pcVar9 = "Invalid PPMd sequence";
      }
      else {
        BVar7 = PpmdRAR_RangeDec_Init((CPpmd7z_RangeDec *)&a_00[9].formats[3].bid);
        if (BVar7 != 0) goto LAB_00667da6;
LAB_00667e56:
        pcVar9 = "Unable to initialize PPMd range decoder";
      }
    }
    else {
      uVar11 = (uint)uVar12 & 0x1f;
      uVar4 = uVar11 * 3 - 0x1d;
      if (uVar11 < 0x10) {
        uVar4 = uVar11 + 1;
      }
      if (uVar4 == 1) {
        pcVar9 = "Truncated RAR file data";
      }
      else {
        p = &a_00->formats[3].seek_data;
        Ppmd7_Free((CPpmd7 *)p);
        a_00[9].formats[3].cleanup = (_func_int_archive_read_ptr *)a;
        a_00[9].formats[3].format_capabilties = ppmd_read;
        local_38 = (CPpmd7z_RangeDec *)&a_00[9].formats[3].bid;
        PpmdRAR_RangeDec_CreateVTable(local_38);
        a_00[9].formats[3].seek_data =
             (_func_int64_t_archive_read_ptr_int64_t_int *)&a_00[9].formats[3].cleanup;
        Ppmd7_Construct((CPpmd7 *)p);
        size = (UInt32)(a_00->client).position;
        if (size != 0) {
          BVar7 = Ppmd7_Alloc((CPpmd7 *)p,size);
          if (BVar7 != 0) {
            BVar7 = PpmdRAR_RangeDec_Init(local_38);
            if (BVar7 == 0) goto LAB_00667e56;
            Ppmd7_Init((CPpmd7 *)p,uVar4);
            *(undefined1 *)&a_00->formats[3].read_data_skip = 1;
            goto LAB_00667da6;
          }
          pcVar9 = "Out of memory";
          goto LAB_00667f48;
        }
        pcVar9 = "Invalid zero dictionary size";
      }
    }
  }
LAB_00667e60:
  iVar5 = 0x54;
LAB_00667e65:
  archive_set_error(&a->archive,iVar5,pcVar9);
  return -0x1e;
}

Assistant:

static int
parse_codes(struct archive_read *a)
{
  int i, j, val, n, r;
  unsigned char bitlengths[MAX_SYMBOLS], zerocount, ppmd_flags;
  unsigned int maxorder;
  struct huffman_code precode;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  free_codes(a);

  /* Skip to the next byte */
  rar_br_consume_unalined_bits(br);

  /* PPMd block flag */
  if (!rar_br_read_ahead(a, br, 1))
    goto truncated_data;
  if ((rar->is_ppmd_block = rar_br_bits(br, 1)) != 0)
  {
    rar_br_consume(br, 1);
    if (!rar_br_read_ahead(a, br, 7))
      goto truncated_data;
    ppmd_flags = rar_br_bits(br, 7);
    rar_br_consume(br, 7);

    /* Memory is allocated in MB */
    if (ppmd_flags & 0x20)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->dictionary_size = (rar_br_bits(br, 8) + 1) << 20;
      rar_br_consume(br, 8);
    }

    if (ppmd_flags & 0x40)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->ppmd_escape = rar->ppmd7_context.InitEsc = rar_br_bits(br, 8);
      rar_br_consume(br, 8);
    }
    else
      rar->ppmd_escape = 2;

    if (ppmd_flags & 0x20)
    {
      maxorder = (ppmd_flags & 0x1F) + 1;
      if(maxorder > 16)
        maxorder = 16 + (maxorder - 16) * 3;

      if (maxorder == 1)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Truncated RAR file data");
        return (ARCHIVE_FATAL);
      }

      /* Make sure ppmd7_contest is freed before Ppmd7_Construct
       * because reading a broken file cause this abnormal sequence. */
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);

      rar->bytein.a = a;
      rar->bytein.Read = &ppmd_read;
      __archive_ppmd7_functions.PpmdRAR_RangeDec_CreateVTable(&rar->range_dec);
      rar->range_dec.Stream = &rar->bytein;
      __archive_ppmd7_functions.Ppmd7_Construct(&rar->ppmd7_context);

      if (rar->dictionary_size == 0) {
	      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid zero dictionary size");
	      return (ARCHIVE_FATAL);
      }

      if (!__archive_ppmd7_functions.Ppmd7_Alloc(&rar->ppmd7_context,
        rar->dictionary_size))
      {
        archive_set_error(&a->archive, ENOMEM,
                          "Out of memory");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
      __archive_ppmd7_functions.Ppmd7_Init(&rar->ppmd7_context, maxorder);
      rar->ppmd_valid = 1;
    }
    else
    {
      if (!rar->ppmd_valid) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid PPMd sequence");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
    }
  }
  else
  {
    rar_br_consume(br, 1);

    /* Keep existing table flag */
    if (!rar_br_read_ahead(a, br, 1))
      goto truncated_data;
    if (!rar_br_bits(br, 1))
      memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
    rar_br_consume(br, 1);

    memset(&bitlengths, 0, sizeof(bitlengths));
    for (i = 0; i < MAX_SYMBOLS;)
    {
      if (!rar_br_read_ahead(a, br, 4))
        goto truncated_data;
      bitlengths[i++] = rar_br_bits(br, 4);
      rar_br_consume(br, 4);
      if (bitlengths[i-1] == 0xF)
      {
        if (!rar_br_read_ahead(a, br, 4))
          goto truncated_data;
        zerocount = rar_br_bits(br, 4);
        rar_br_consume(br, 4);
        if (zerocount)
        {
          i--;
          for (j = 0; j < zerocount + 2 && i < MAX_SYMBOLS; j++)
            bitlengths[i++] = 0;
        }
      }
    }

    memset(&precode, 0, sizeof(precode));
    r = create_code(a, &precode, bitlengths, MAX_SYMBOLS, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK) {
      free(precode.tree);
      free(precode.table);
      return (r);
    }

    for (i = 0; i < HUFFMAN_TABLE_SIZE;)
    {
      if ((val = read_next_symbol(a, &precode)) < 0) {
        free(precode.tree);
        free(precode.table);
        return (ARCHIVE_FATAL);
      }
      if (val < 16)
      {
        rar->lengthtable[i] = (rar->lengthtable[i] + val) & 0xF;
        i++;
      }
      else if (val < 18)
      {
        if (i == 0)
        {
          free(precode.tree);
          free(precode.table);
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file.");
          return (ARCHIVE_FATAL);
        }

        if(val == 16) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for (j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
        {
          rar->lengthtable[i] = rar->lengthtable[i-1];
          i++;
        }
      }
      else
      {
        if(val == 18) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for(j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
          rar->lengthtable[i++] = 0;
      }
    }
    free(precode.tree);
    free(precode.table);

    r = create_code(a, &rar->maincode, &rar->lengthtable[0], MAINCODE_SIZE,
                MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->offsetcode, &rar->lengthtable[MAINCODE_SIZE],
                OFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lowoffsetcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE],
                LOWOFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lengthcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE +
                LOWOFFSETCODE_SIZE], LENGTHCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
  }

  if (!rar->dictionary_size || !rar->lzss.window)
  {
    /* Seems as though dictionary sizes are not used. Even so, minimize
     * memory usage as much as possible.
     */
    void *new_window;
    unsigned int new_size;

    if (rar->unp_size >= DICTIONARY_MAX_SIZE)
      new_size = DICTIONARY_MAX_SIZE;
    else
      new_size = rar_fls((unsigned int)rar->unp_size) << 1;
    if (new_size == 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Zero window size is invalid.");
      return (ARCHIVE_FATAL);
    }
    new_window = realloc(rar->lzss.window, new_size);
    if (new_window == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
    rar->lzss.window = (unsigned char *)new_window;
    rar->dictionary_size = new_size;
    memset(rar->lzss.window, 0, rar->dictionary_size);
    rar->lzss.mask = rar->dictionary_size - 1;
  }

  rar->start_new_table = 0;
  return (ARCHIVE_OK);
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
}